

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O2

db_bit * __thiscall lan::db::find_any(db *this,string *name,db_bit_type type,db_bit *ref)

{
  bool bVar1;
  db_bit *pdVar2;
  out_of_range *this_00;
  db *this_01;
  allocator<char> local_91;
  string local_90;
  string local_70;
  string local_50;
  
  bVar1 = std::operator==(name,"@");
  pdVar2 = this->anchor;
  if (!bVar1 || pdVar2 == (db_bit *)0x0) {
    bVar1 = std::operator==(name,"@");
    if (bVar1) {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      this_01 = (db *)0x10a0a6;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_91);
      error_string(&local_70,this_01,_empty_anchor_error,&local_90);
      std::out_of_range::out_of_range(this_00,(string *)&local_70);
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    while( true ) {
      std::__cxx11::string::string((string *)&local_50,(string *)name);
      pdVar2 = find(this,&local_50,ref);
      std::__cxx11::string::~string((string *)&local_50);
      if (pdVar2 == (db_bit *)0x0) break;
      if (pdVar2->type == type) {
        return pdVar2;
      }
      ref = pdVar2->nex;
    }
    pdVar2 = (db_bit *)0x0;
  }
  return pdVar2;
}

Assistant:

lan::db_bit * db::find_any(const std::string name, const lan::db_bit_type type, lan::db_bit * ref){
            lan::db_bit * buf = nullptr;
            if(name == "@" && anchor) return anchor;
            else if(name == "@") throw lan::errors::anchor_name_error(error_string(errors::_private::_empty_anchor_error, ""));
            while ((buf = find(name, ref))) {
                if(buf->type == type) return buf;
                ref = buf->nex;
            } return nullptr;
        }